

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.h
# Opt level: O2

void __thiscall CChainParams::CChainParams(CChainParams *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  Consensus::Params::Params(&this->consensus);
  memset(&this->vSeeds,0,0x90);
  (this->bech32_hrp)._M_dataplus._M_p = (pointer)&(this->bech32_hrp).field_2;
  (this->bech32_hrp)._M_string_length = 0;
  (this->bech32_hrp).field_2._M_local_buf[0] = '\0';
  CBlock::CBlock(&this->genesis);
  (this->vFixedSeeds).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vFixedSeeds).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vFixedSeeds).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->checkpointData).mapCheckpoints._M_t._M_impl.super__Rb_tree_header;
  (this->checkpointData).mapCheckpoints._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->checkpointData).mapCheckpoints._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->checkpointData).mapCheckpoints._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->checkpointData).mapCheckpoints._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    (this->m_assumeutxo_data).super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->m_assumeutxo_data).super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->checkpointData).mapCheckpoints._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (this->m_assumeutxo_data).super__Vector_base<AssumeutxoData,_std::allocator<AssumeutxoData>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

CChainParams() = default;